

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O2

bool deqp::gls::TextureStateQueryTests::anon_unknown_1::isCoreQuery
               (ContextType *contextType,QueryType query)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  
  bVar1 = glu::contextSupports((ContextType)(contextType->super_ApiType).m_bits,(ApiType)0x23);
  if (bVar1) {
    if (QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER_VEC4 < query) goto LAB_0083b028;
    uVar3 = 0x3fc1fe00000;
LAB_0083b04b:
    bVar2 = (byte)(uVar3 >> ((byte)query & 0x3f));
  }
  else {
    bVar1 = glu::contextSupports((ContextType)(contextType->super_ApiType).m_bits,(ApiType)0x13);
    if (bVar1) {
      if (query < QUERY_SAMPLER_PARAM_PURE_INTEGER_VEC4) {
LAB_0083b041:
        uVar3 = 0xcc06600000;
        goto LAB_0083b04b;
      }
    }
    else {
      bVar1 = glu::contextSupports((ContextType)(contextType->super_ApiType).m_bits,(ApiType)0x3);
      if (bVar1 && query < QUERY_SAMPLER_PARAM_PURE_INTEGER_VEC4) goto LAB_0083b041;
    }
LAB_0083b028:
    bVar2 = 0;
  }
  return (bool)(bVar2 & 1);
}

Assistant:

static bool isCoreQuery (const glu::ContextType& contextType, QueryType query)
{
	if (contextSupports(contextType, glu::ApiType::es(3,2)))
		return es32::isCoreQuery(query);
	else if (contextSupports(contextType, glu::ApiType::es(3,1)))
		return es31::isCoreQuery(query);
	else if (contextSupports(contextType, glu::ApiType::es(3,0)))
		return es30::isCoreQuery(query);
	else
	{
		DE_ASSERT(false);
		return DE_NULL;
	}
}